

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O3

bool_t beltMACStepV2(octet *mac,size_t mac_len,void *state)

{
  bool_t bVar1;
  
  beltMACStepG_internal(state);
  bVar1 = memEq(mac,(void *)((long)state + 0x40),mac_len);
  return bVar1;
}

Assistant:

bool_t beltMACStepV2(const octet mac[], size_t mac_len, void* state)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(mac_len <= 8);
	ASSERT(memIsValid(mac, mac_len));
	beltMACStepG_internal(st);
#if (OCTET_ORDER == BIG_ENDIAN)
	st->mac[0] = u32Rev(st->mac[0]);
	st->mac[1] = u32Rev(st->mac[1]);
#endif
	return memEq(mac, st->mac, mac_len);
}